

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_macro.c
# Opt level: O1

uint string_to_status_code(char *status_code_string)

{
  int iVar1;
  uint i;
  long lVar2;
  char **ppcVar3;
  
  ppcVar3 = status_code_strings;
  lVar2 = 0;
  do {
    iVar1 = strcmp(*ppcVar3,status_code_string);
    if (iVar1 == 0) goto LAB_001011ac;
    lVar2 = lVar2 + 1;
    ppcVar3 = ppcVar3 + 1;
  } while (lVar2 != 3);
  lVar2 = 0xffffffff;
LAB_001011ac:
  return (uint)lVar2;
}

Assistant:

unsigned int string_to_status_code(const char* const status_code_string) {
    unsigned int i;
    for (i = 0; i < sizeof(status_code_strings) /
                    sizeof(status_code_strings[0]); i++) {
        if (strcmp(status_code_strings[i], status_code_string) == 0) {
            return i;
        }
    }
    return ~0U;
}